

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_0::VertexAttributeEnabledCase::test
          (VertexAttributeEnabledCase *this)

{
  CallLogWrapper *gl;
  GLenum in_R8D;
  
  gl = &(this->super_ApiCase).super_CallLogWrapper;
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,0,in_R8D);
  glu::CallLogWrapper::glEnableVertexAttribArray(gl,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,1,in_R8D);
  glu::CallLogWrapper::glDisableVertexAttribArray(gl,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,gl
                     ,0x8622,0,in_R8D);
  return;
}

Assistant:

void test (void)
	{
		// VERTEX_ATTRIB_ARRAY_ENABLED

		verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_FALSE);
		glEnableVertexAttribArray(0);
		verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_TRUE);
		glDisableVertexAttribArray(0);
		verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, GL_FALSE);
	}